

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O1

int Wlc_NtkDupOneObject(Wlc_Ntk_t *pNew,Wlc_Ntk_t *p,Wlc_Obj_t *pObj,int TypeNew,Vec_Int_t *vFanins)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint iObj;
  
  iObj = (int)((long)pObj - (long)p->pObjs >> 3) * -0x55555555;
  if (((int)iObj < 0) || ((p->vCopies).nSize <= (int)iObj)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar1 = *(ushort *)pObj;
  uVar5 = pObj->nFanins;
  iVar2 = (p->vCopies).pArray[iObj & 0x7fffffff];
  *(ushort *)pObj = uVar1 & 0xffc0 | (ushort)TypeNew & 0x3f;
  pObj->nFanins = 0;
  iVar3 = Wlc_ObjDup(pNew,p,iObj,vFanins);
  *(ushort *)pObj = uVar1 & 0x3f | (ushort)*(undefined4 *)pObj & 0xffc0;
  pObj->nFanins = uVar5;
  if (TypeNew == 3) {
    uVar4 = pObj->End - pObj->Beg;
    uVar5 = -uVar4;
    if (0 < (int)uVar4) {
      uVar5 = uVar4;
    }
    Vec_IntPush(pNew->vInits,~uVar5);
    if ((p->vCopies).nSize <= (int)iObj) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    (p->vCopies).pArray[iObj & 0x7fffffff] = iVar2;
  }
  return iVar3;
}

Assistant:

int Wlc_NtkDupOneObject( Wlc_Ntk_t * pNew, Wlc_Ntk_t * p, Wlc_Obj_t * pObj, int TypeNew, Vec_Int_t * vFanins )
{
    int iObj = Wlc_ObjId(p, pObj);
    unsigned Type = pObj->Type;
    int iObjNew, nFanins = Wlc_ObjFaninNum(pObj);
    int iObjCopy = Wlc_ObjCopy(p, iObj);
    pObj->Type = TypeNew;
    pObj->nFanins = 0;
    iObjNew = Wlc_ObjDup( pNew, p, iObj, vFanins );
    pObj->Type = Type;
    pObj->nFanins = (unsigned)nFanins;
    if ( TypeNew == WLC_OBJ_FO )
    {
        Vec_IntPush( pNew->vInits, -Wlc_ObjRange(pObj) );
        Wlc_ObjSetCopy( p, iObj, iObjCopy );
    }
    return iObjNew;
}